

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLin>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  ImPlotPlot *pIVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ImPlotContext *gp;
  ImPlotContext *pIVar9;
  undefined1 auVar10 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_70;
  float local_64;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot->CurrentPlot;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar7 = getter->Count;
    local_48 = iVar7 + -1;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    iVar7 = transformer->YAxis;
    local_3c.x = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                         (pIVar5->XAxis).Range.Min) * GImPlot->Mx +
                        (double)GImPlot->PixelRange[iVar7].Min.x);
    local_3c.y = (float)(((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) -
                         pIVar5->YAxis[iVar7].Range.Min) * GImPlot->My[iVar7] +
                        (double)GImPlot->PixelRange[iVar7].Min.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
                *)local_58,DrawList,&pIVar5->PlotRect);
  }
  else {
    iVar7 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    iVar7 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         (((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
          (pIVar5->XAxis).Range.Min) * GImPlot->Mx + (double)GImPlot->PixelRange[iVar7].Min.x);
    local_58._4_4_ =
         (undefined4)
         (((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) -
          pIVar5->YAxis[iVar7].Range.Min) * GImPlot->My[iVar7] +
         (double)GImPlot->PixelRange[iVar7].Min.y);
    iVar7 = getter->Count;
    if (1 < iVar7) {
      iVar8 = 1;
      local_60 = GImPlot;
      pIVar9 = GImPlot;
      local_64 = line_weight;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        auVar10._8_4_ = (int)(uVar4 >> 0x20);
        auVar10._0_8_ = uVar4;
        auVar10._12_4_ = 0x45300000;
        iVar7 = transformer->YAxis;
        local_70.x = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar7].Min.x);
        local_70.y = (float)((((auVar10._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) -
                             GImPlot->CurrentPlot->YAxis[iVar7].Range.Min) * GImPlot->My[iVar7] +
                            (double)GImPlot->PixelRange[iVar7].Min.y);
        pIVar5 = pIVar9->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (local_70.y <= (float)local_58._4_4_) {
          fVar2 = local_70.y;
        }
        if ((fVar2 < (pIVar5->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(local_70.y <= (float)local_58._4_4_) & (uint)local_70.y |
                           local_58._4_4_ & -(uint)(local_70.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar2 = local_70.x;
          }
          if ((fVar2 < (pIVar5->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar5->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_70,col,line_weight);
            pIVar9 = local_60;
            line_weight = local_64;
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}